

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmNinjaNormalTargetGenerator.cxx
# Opt level: O0

string * __thiscall
cmNinjaNormalTargetGenerator::LanguageLinkerRule
          (string *__return_storage_ptr__,cmNinjaNormalTargetGenerator *this,string *config)

{
  TargetType targetType;
  cmGeneratorTarget *pcVar1;
  string *args;
  string *name;
  string local_70;
  string local_40;
  string *local_20;
  string *config_local;
  cmNinjaNormalTargetGenerator *this_local;
  
  local_20 = config;
  config_local = (string *)this;
  this_local = (cmNinjaNormalTargetGenerator *)__return_storage_ptr__;
  TargetLinkLanguage(&local_40,this,config);
  pcVar1 = cmNinjaTargetGenerator::GetGeneratorTarget(&this->super_cmNinjaTargetGenerator);
  targetType = cmGeneratorTarget::GetType(pcVar1);
  args = cmState::GetTargetTypeName_abi_cxx11_(targetType);
  pcVar1 = cmNinjaTargetGenerator::GetGeneratorTarget(&this->super_cmNinjaTargetGenerator);
  name = cmGeneratorTarget::GetName_abi_cxx11_(pcVar1);
  cmGlobalNinjaGenerator::EncodeRuleName(&local_70,name);
  cmStrCat<std::__cxx11::string,char_const(&)[2],std::__cxx11::string_const&,char_const(&)[10],std::__cxx11::string,char_const(&)[2],std::__cxx11::string_const&>
            (__return_storage_ptr__,&local_40,(char (*) [2])0x1078f40,args,(char (*) [10])0x106ef5d,
             &local_70,(char (*) [2])0x1078f40,local_20);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_40);
  return __return_storage_ptr__;
}

Assistant:

std::string cmNinjaNormalTargetGenerator::LanguageLinkerRule(
  const std::string& config) const
{
  return cmStrCat(
    this->TargetLinkLanguage(config), "_",
    cmState::GetTargetTypeName(this->GetGeneratorTarget()->GetType()),
    "_LINKER__",
    cmGlobalNinjaGenerator::EncodeRuleName(
      this->GetGeneratorTarget()->GetName()),
    "_", config);
}